

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

float similarity(string *s0,string *s1)

{
  char cVar1;
  pointer piVar2;
  value_type vVar3;
  long lVar4;
  reference pvVar5;
  int *piVar6;
  char *pcVar7;
  vector<int,_std::allocator<int>_> *this;
  ulong in_RSI;
  ulong in_RDI;
  float fVar8;
  float dist;
  size_t j;
  size_t i_1;
  size_t i;
  vector<int,_std::allocator<int>_> prevCol;
  vector<int,_std::allocator<int>_> col;
  size_t len1;
  size_t len0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int iVar9;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff10;
  bool local_d9;
  unsigned_long local_a8;
  unsigned_long local_a0;
  float local_98;
  int local_94;
  int local_90;
  int local_8c;
  ulong local_88;
  ulong local_80;
  size_type local_78;
  undefined4 local_6c;
  vector<int,_std::allocator<int>_> local_68;
  undefined4 local_3c;
  vector<int,_std::allocator<int>_> local_38;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  ulong local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  lVar4 = std::__cxx11::string::size();
  local_18 = lVar4 + 1;
  lVar4 = std::__cxx11::string::size();
  local_20 = lVar4 + 1;
  local_3c = 0;
  std::allocator<int>::allocator((allocator<int> *)0x123261);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff10,CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
             ,(value_type_conflict2 *)in_stack_ffffffffffffff00,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::allocator<int>::~allocator((allocator<int> *)0x12328f);
  local_6c = 0;
  std::allocator<int>::allocator((allocator<int> *)0x1232b9);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff10,CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
             ,(value_type_conflict2 *)in_stack_ffffffffffffff00,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::allocator<int>::~allocator((allocator<int> *)0x1232e7);
  for (local_78 = 0; local_78 < local_20; local_78 = local_78 + 1) {
    vVar3 = (value_type)local_78;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_68,local_78);
    *pvVar5 = vVar3;
  }
  for (local_80 = 0; local_80 < local_18; local_80 = local_80 + 1) {
    vVar3 = (value_type)local_80;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,0);
    *pvVar5 = vVar3;
    for (local_88 = 1; local_88 < local_20; local_88 = local_88 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,local_88 - 1);
      local_8c = *pvVar5 + 1;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_68,local_88);
      local_90 = *pvVar5 + 1;
      piVar6 = std::min<int>(&local_8c,&local_90);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_68,local_88 - 1);
      iVar9 = *pvVar5;
      local_d9 = false;
      if (local_80 != 0) {
        pcVar7 = (char *)std::__cxx11::string::operator[](local_8);
        cVar1 = *pcVar7;
        pcVar7 = (char *)std::__cxx11::string::operator[](local_10);
        local_d9 = cVar1 == *pcVar7;
      }
      local_94 = iVar9 + ((byte)~local_d9 & 1);
      piVar6 = std::min<int>(piVar6,&local_94);
      iVar9 = *piVar6;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,local_88);
      *pvVar5 = iVar9;
    }
    std::vector<int,_std::allocator<int>_>::swap
              (in_stack_ffffffffffffff00,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_68,local_20 - 1);
  fVar8 = (float)*pvVar5;
  local_98 = fVar8;
  local_a0 = std::__cxx11::string::size();
  local_a8 = std::__cxx11::string::size();
  this = (vector<int,_std::allocator<int>_> *)std::max<unsigned_long>(&local_a0,&local_a8);
  piVar2 = (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  std::vector<int,_std::allocator<int>_>::~vector(this);
  std::vector<int,_std::allocator<int>_>::~vector(this);
  return 1.0 - fVar8 / (float)piVar2;
}

Assistant:

float similarity(const std::string & s0, const std::string & s1) {
    const size_t len0 = s0.size() + 1;
    const size_t len1 = s1.size() + 1;

    std::vector<int> col(len1, 0);
    std::vector<int> prevCol(len1, 0);

    for (size_t i = 0; i < len1; i++) {
        prevCol[i] = i;
    }

    for (size_t i = 0; i < len0; i++) {
        col[0] = i;
        for (size_t j = 1; j < len1; j++) {
            col[j] = std::min(std::min(1 + col[j - 1], 1 + prevCol[j]), prevCol[j - 1] + (i > 0 && s0[i - 1] == s1[j - 1] ? 0 : 1));
        }
        col.swap(prevCol);
    }

    const float dist = prevCol[len1 - 1];

    return 1.0f - (dist / std::max(s0.size(), s1.size()));
}